

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall Am_Network_Group::Broadcast(Am_Network_Group *this,Am_Object *obj)

{
  bool bVar1;
  Am_Value *this_00;
  Am_Connection *this_01;
  Am_Connection *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value local_90;
  Am_Value local_80 [2];
  Am_Value local_60;
  Am_Connection *local_50;
  Am_Ptr b_ptr;
  Am_Assoc b_assoc;
  Am_Value *b_val;
  uintptr_t bless_id;
  uintptr_t conn_id;
  Am_Connection *conn_ptr;
  Am_Ptr mistyped_ptr;
  Am_Object *obj_local;
  Am_Network_Group *this_local;
  
  Am_Value_List::Start(&this->Member_Connections);
  while (bVar1 = Am_Value_List::Last(&this->Member_Connections), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = Am_Value_List::Get(&this->Member_Connections);
    this_01 = (Am_Connection *)Am_Value::operator_cast_to_void_(this_00);
    b_assoc.data = (Am_Assoc_Data *)Am_Object::Peek(obj,Am_NET_BLESSING,0);
    bVar1 = Am_Value::operator!=((Am_Value *)b_assoc.data,&Am_No_Value);
    if (bVar1) {
      Am_Assoc::Am_Assoc((Am_Assoc *)&b_ptr,(Am_Value *)b_assoc.data);
      Am_Assoc::Value_1((Am_Assoc *)&local_60);
      pAVar2 = (Am_Connection *)Am_Value::operator_cast_to_void_(&local_60);
      Am_Value::~Am_Value(&local_60);
      local_50 = pAVar2;
      if (pAVar2 != this_01) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
        Am_Value::Am_Value(local_80,pAVar3);
        Am_Connection::Send(this_01,local_80);
        Am_Value::~Am_Value(local_80);
      }
      Am_Assoc::~Am_Assoc((Am_Assoc *)&b_ptr);
    }
    else {
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
      Am_Value::Am_Value(&local_90,pAVar3);
      Am_Connection::Send(this_01,&local_90);
      Am_Value::~Am_Value(&local_90);
    }
    Am_Value_List::Next(&this->Member_Connections);
  }
  return;
}

Assistant:

void
Am_Network_Group::Broadcast(Am_Object obj)
{
  Am_Ptr mistyped_ptr;
  Am_Connection *conn_ptr;
  uintptr_t conn_id, bless_id;
  for (Member_Connections.Start(); !(Member_Connections.Last());
       Member_Connections.Next()) {
    mistyped_ptr = Member_Connections.Get();
    conn_ptr = (Am_Connection *)mistyped_ptr;
    const Am_Value& b_val = obj.Peek(Am_NET_BLESSING);
    if (b_val != Am_No_Value) {
      Am_Assoc b_assoc = b_val;
      Am_Ptr b_ptr = b_assoc.Value_1();
      bless_id = (uintptr_t)b_ptr;
      conn_id = (uintptr_t)conn_ptr;
      if (bless_id != conn_id) {
        conn_ptr->Send((Am_Value)obj);
      } else {
      }
    } else {
      conn_ptr->Send((Am_Value)obj);
    }
  }
}